

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_2,int iteration)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_ffffffffffffff98;
  string local_58 [16];
  undefined8 in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  StreamableToString<int>((int *)in_stack_ffffffffffffffb8);
  std::operator+(in_stack_ffffffffffffff98,__rhs);
  SendLn((StreamingListener *)__rhs,in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    SendLn("event=TestIterationStart&iteration=" +
           StreamableToString(iteration));
  }